

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digraph.h
# Opt level: O1

Count degDist(CGraph *g,VertexIdx *degdistarray)

{
  EdgeIdx *pEVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if (0 < g->nVertices) {
    lVar2 = 0;
    do {
      degdistarray[lVar2] = 0;
      lVar2 = lVar2 + 1;
    } while (lVar2 < g->nVertices);
  }
  if (0 < g->nVertices) {
    pEVar1 = g->offsets;
    lVar2 = 0;
    lVar3 = 0;
    do {
      lVar4 = pEVar1[lVar2 + 1] - pEVar1[lVar2];
      if (lVar3 < lVar4) {
        lVar3 = lVar4;
      }
      degdistarray[lVar4] = degdistarray[lVar4] + 1;
      lVar2 = lVar2 + 1;
    } while (lVar2 < g->nVertices);
    return lVar3;
  }
  return 0;
}

Assistant:

Count degDist(CGraph *g, VertexIdx *degdistarray) {
    VertexIdx deg, maxdeg = 0; // variable for maximum degree
    VertexIdx i; // index for looping

    for (i = 0; i < g->nVertices; ++i) //looping to initialize degdistarray to all zeroes
        degdistarray[i] = 0;

    for (i = 0; i < g->nVertices; ++i) {
        deg = g->offsets[i + 1] - g->offsets[i]; // computing degree of vertex i
        if (deg > maxdeg)
            maxdeg = deg; //update maximum degree

        degdistarray[deg]++; //increment number of degree deg vertices
    }

    return maxdeg; //return maximum degree
}